

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

QSizeF __thiscall
QGraphicsLinearLayout::sizeHint(QGraphicsLinearLayout *this,SizeHint which,QSizeF *constraint)

{
  QGraphicsLinearLayoutPrivate *pQVar1;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  qreal qVar2;
  QSizeF QVar3;
  QGraphicsLinearLayoutPrivate *d;
  QSizeF extraMargins;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  QSizeF *s2;
  undefined4 in_stack_ffffffffffffff58;
  QGraphicsLinearLayoutPrivate *this_00;
  undefined1 local_58 [16];
  qreal local_48;
  qreal local_40;
  _func_int **local_38;
  QSizePolicy QStack_30;
  undefined4 uStack_2c;
  QGraphicsLayoutItem *local_28;
  QSizeF *local_20;
  double local_18;
  double local_10;
  qreal local_8;
  
  local_8 = *(qreal *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QGraphicsLinearLayout *)0x9b7c48);
  local_10 = -NAN;
  local_18 = -NAN;
  local_20 = (QSizeF *)0xffffffffffffffff;
  local_28 = (QGraphicsLayoutItem *)0xffffffffffffffff;
  (**(code **)(*in_RDI + 0x18))
            (in_RDI,&stack0xfffffffffffffff0,&stack0xffffffffffffffe8,&stack0xffffffffffffffe0,
             &stack0xffffffffffffffd8);
  local_38 = (_func_int **)0xffffffffffffffff;
  QStack_30.field_0 = (anon_union_4_2_313b0b05_for_QSizePolicy_1)0xffffffff;
  uStack_2c = 0xffffffff;
  this_00 = (QGraphicsLinearLayoutPrivate *)&stack0xffffffffffffffc8;
  QSizeF::QSizeF((QSizeF *)this_00,local_10 + (double)local_20,local_18 + (double)local_28);
  s2 = (QSizeF *)&pQVar1->engine;
  QVar3 = ::operator-((QSizeF *)CONCAT44(in_ESI,in_stack_ffffffffffffff58),s2);
  qVar2 = QVar3.ht;
  local_58._0_8_ = QVar3.wd;
  local_58._8_8_ = qVar2;
  QGraphicsLinearLayoutPrivate::styleInfo(this_00);
  local_48 = (qreal)QGridLayoutEngine::sizeHint
                              ((SizeHint)s2,(QSizeF *)(ulong)in_ESI,
                               (QAbstractLayoutStyleInfo *)local_58);
  local_40 = qVar2;
  QVar3 = ::operator+((QSizeF *)CONCAT44(in_ESI,in_stack_ffffffffffffff58),s2);
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsLinearLayout::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_D(const QGraphicsLinearLayout);
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    const QSizeF extraMargins(left + right, top + bottom);
    return d->engine.sizeHint(which , constraint - extraMargins, d->styleInfo()) + extraMargins;
}